

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree-test.c++
# Opt level: O2

void __thiscall kj::_::anon_unknown_0::TestCase29::run(TestCase29 *this)

{
  char (*in_RCX) [4];
  String *__return_storage_ptr__;
  char (*params) [4];
  char (*params_00) [4];
  size_t extraout_RDX;
  size_t sVar1;
  size_t extraout_RDX_00;
  char (*params_01) [4];
  char (*params_02) [4];
  char (*params_03) [4];
  char (*params_04) [4];
  long lVar2;
  ArrayDisposer *pAVar3;
  char *params_2;
  ArrayDisposer *pAVar4;
  StringTree *this_00;
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> part_00;
  longlong *in_stack_fffffffffffffef8;
  uint pieceCount;
  undefined1 local_e4 [4];
  char *local_e0;
  Array<char> local_d8;
  DebugComparison<const_char_(&)[10],_kj::String> _kjCondition_4;
  DebugComparison<const_char_(&)[7],_kj::String> _kjCondition;
  Array<char> local_50;
  undefined4 local_34;
  
  local_d8.ptr = "foobar";
  strTree<char_const(&)[4],char_const(&)[4]>
            ((StringTree *)&_kjCondition_4,(kj *)0x423c58,(char (*) [4])0x401abd,in_RCX);
  StringTree::flatten((String *)&pieceCount,(StringTree *)&_kjCondition_4);
  DebugExpression<char_const(&)[7]>::operator==
            (&_kjCondition,(DebugExpression<char_const(&)[7]> *)&local_d8,(String *)&pieceCount);
  Array<char>::~Array((Array<char> *)&pieceCount);
  StringTree::~StringTree((StringTree *)&_kjCondition_4);
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    strTree<char_const(&)[4],char_const(&)[4]>
              ((StringTree *)&_kjCondition_4,(kj *)0x423c58,(char (*) [4])0x401abd,in_RCX);
    StringTree::flatten((String *)&pieceCount,(StringTree *)&_kjCondition_4);
    Debug::
    log<char_const(&)[65],kj::_::DebugComparison<char_const(&)[7],kj::String>&,char_const(&)[7],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
               ,0x1e,ERROR,
               "\"failed: expected \" \"(\\\"foobar\\\") == (strTree(\\\"foo\\\", \\\"bar\\\").flatten())\", _kjCondition, \"foobar\", strTree(\"foo\", \"bar\").flatten()"
               ,(char (*) [65])
                "failed: expected (\"foobar\") == (strTree(\"foo\", \"bar\").flatten())",
               &_kjCondition,(char (*) [7])0x42451a,(String *)&pieceCount);
    Array<char>::~Array((Array<char> *)&pieceCount);
    StringTree::~StringTree((StringTree *)&_kjCondition_4);
  }
  Array<char>::~Array(&_kjCondition.right.content);
  local_d8.ptr = "1 2 3 4";
  local_e4[0] = (kj)0x1;
  local_e4[1] = '\0';
  local_e4[2] = '\0';
  local_e4[3] = '\0';
  local_34 = 2;
  local_50.ptr = (char *)0x3;
  local_e0 = (char *)0x4;
  strTree<int,char_const(&)[2],unsigned_int,char_const(&)[2],long,char_const(&)[2],long_long>
            ((StringTree *)&_kjCondition_4,(kj *)local_e4,(int *)0x44d305,
             (char (*) [2])&stack0xffffffffffffffcc,(uint *)0x44d305,(char (*) [2])&local_50,
             (long *)0x44d305,(char (*) [2])&local_e0,in_stack_fffffffffffffef8);
  StringTree::flatten((String *)&pieceCount,(StringTree *)&_kjCondition_4);
  DebugExpression<char_const(&)[8]>::operator==
            ((DebugComparison<const_char_(&)[8],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[8]> *)&local_d8,(String *)&pieceCount);
  Array<char>::~Array((Array<char> *)&pieceCount);
  StringTree::~StringTree((StringTree *)&_kjCondition_4);
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    local_e0 = (char *)CONCAT44(local_e0._4_4_,1);
    local_e4[0] = (kj)0x2;
    local_e4[1] = '\0';
    local_e4[2] = '\0';
    local_e4[3] = '\0';
    local_d8.ptr = (char *)0x3;
    local_50.ptr = &DAT_00000004;
    strTree<int,char_const(&)[2],unsigned_int,char_const(&)[2],long,char_const(&)[2],long_long>
              ((StringTree *)&_kjCondition_4,(kj *)&local_e0,(int *)0x44d305,(char (*) [2])local_e4,
               (uint *)0x44d305,(char (*) [2])&local_d8,(long *)0x44d305,(char (*) [2])&local_50,
               in_stack_fffffffffffffef8);
    StringTree::flatten((String *)&pieceCount,(StringTree *)&_kjCondition_4);
    Debug::
    log<char_const(&)[83],kj::_::DebugComparison<char_const(&)[8],kj::String>&,char_const(&)[8],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
               ,0x1f,ERROR,
               "\"failed: expected \" \"(\\\"1 2 3 4\\\") == (strTree(1, \\\" \\\", 2u, \\\" \\\", 3l, \\\" \\\", 4ll).flatten())\", _kjCondition, \"1 2 3 4\", strTree(1, \" \", 2u, \" \", 3l, \" \", 4ll).flatten()"
               ,(char (*) [83])
                "failed: expected (\"1 2 3 4\") == (strTree(1, \" \", 2u, \" \", 3l, \" \", 4ll).flatten())"
               ,(DebugComparison<const_char_(&)[8],_kj::String> *)&_kjCondition,
               (char (*) [8])"1 2 3 4",(String *)&pieceCount);
    Array<char>::~Array((Array<char> *)&pieceCount);
    StringTree::~StringTree((StringTree *)&_kjCondition_4);
  }
  Array<char>::~Array(&_kjCondition.right.content);
  local_d8.ptr = "1.5 foo 1e15 bar -3";
  local_e0 = (char *)CONCAT44(local_e0._4_4_,0x3fc00000);
  local_50.ptr = (char *)0x430c6bf526340000;
  local_e4[0] = (kj)0xfd;
  local_e4[1] = -1;
  local_e4[2] = -1;
  local_e4[3] = -1;
  params_2 = " bar ";
  strTree<float,char_const(&)[6],double,char_const(&)[6],int>
            ((StringTree *)&_kjCondition_4,(kj *)&local_e0,(float *)" foo ",(char (*) [6])&local_50,
             (double *)" bar ",(char (*) [6])local_e4,(int *)in_stack_fffffffffffffef8);
  StringTree::flatten((String *)&pieceCount,(StringTree *)&_kjCondition_4);
  DebugExpression<char_const(&)[20]>::operator==
            ((DebugComparison<const_char_(&)[20],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[20]> *)&local_d8,(String *)&pieceCount);
  Array<char>::~Array((Array<char> *)&pieceCount);
  StringTree::~StringTree((StringTree *)&_kjCondition_4);
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    local_50.ptr = (char *)CONCAT44(local_50.ptr._4_4_,0x3fc00000);
    local_d8.ptr = (char *)0x430c6bf526340000;
    local_e0 = (char *)CONCAT44(local_e0._4_4_,0xfffffffd);
    strTree<float,char_const(&)[6],double,char_const(&)[6],int>
              ((StringTree *)&_kjCondition_4,(kj *)&local_50,(float *)" foo ",
               (char (*) [6])&local_d8,(double *)" bar ",(char (*) [6])&local_e0,
               (int *)in_stack_fffffffffffffef8);
    StringTree::flatten((String *)&pieceCount,(StringTree *)&_kjCondition_4);
    params_2 = 
    "failed: expected (\"1.5 foo 1e15 bar -3\") == (strTree(1.5f, \" foo \", 1e15, \" bar \", -3).flatten())"
    ;
    Debug::
    log<char_const(&)[98],kj::_::DebugComparison<char_const(&)[20],kj::String>&,char_const(&)[20],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
               ,0x20,ERROR,
               "\"failed: expected \" \"(\\\"1.5 foo 1e15 bar -3\\\") == (strTree(1.5f, \\\" foo \\\", 1e15, \\\" bar \\\", -3).flatten())\", _kjCondition, \"1.5 foo 1e15 bar -3\", strTree(1.5f, \" foo \", 1e15, \" bar \", -3).flatten()"
               ,(char (*) [98])
                "failed: expected (\"1.5 foo 1e15 bar -3\") == (strTree(1.5f, \" foo \", 1e15, \" bar \", -3).flatten())"
               ,(DebugComparison<const_char_(&)[20],_kj::String> *)&_kjCondition,
               (char (*) [20])"1.5 foo 1e15 bar -3",(String *)&pieceCount);
    Array<char>::~Array((Array<char> *)&pieceCount);
    StringTree::~StringTree((StringTree *)&_kjCondition_4);
  }
  Array<char>::~Array(&_kjCondition.right.content);
  local_d8.ptr = "foo";
  local_50.ptr._0_1_ = 0x66;
  local_e0._0_1_ = (kj)0x6f;
  __return_storage_ptr__ = (String *)local_e4;
  local_e4[0] = (kj)0x6f;
  strTree<char,char,char>
            ((StringTree *)&_kjCondition_4,(kj *)&local_50,(char *)&local_e0,
             (char *)__return_storage_ptr__,params_2);
  StringTree::flatten((String *)&pieceCount,(StringTree *)&_kjCondition_4);
  DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&local_d8,(String *)&pieceCount);
  Array<char>::~Array((Array<char> *)&pieceCount);
  StringTree::~StringTree((StringTree *)&_kjCondition_4);
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    local_d8.ptr = (char *)CONCAT71(local_d8.ptr._1_7_,0x66);
    local_50.ptr._0_1_ = 0x6f;
    local_e0._0_1_ = (kj)0x6f;
    strTree<char,char,char>
              ((StringTree *)&_kjCondition_4,(kj *)&local_d8,(char *)&local_50,(char *)&local_e0,
               params_2);
    __return_storage_ptr__ = (String *)&pieceCount;
    StringTree::flatten(__return_storage_ptr__,(StringTree *)&_kjCondition_4);
    params_2 = "failed: expected (\"foo\") == (strTree(\'f\', \'o\', \'o\').flatten())";
    Debug::
    log<char_const(&)[63],kj::_::DebugComparison<char_const(&)[4],kj::String>&,char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
               ,0x21,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (strTree(\'f\', \'o\', \'o\').flatten())\", _kjCondition, \"foo\", strTree(\'f\', \'o\', \'o\').flatten()"
               ,(char (*) [63])
                "failed: expected (\"foo\") == (strTree(\'f\', \'o\', \'o\').flatten())",
               (DebugComparison<const_char_(&)[4],_kj::String> *)&_kjCondition,
               (char (*) [4])0x423c58,__return_storage_ptr__);
    Array<char>::~Array((Array<char> *)&pieceCount);
    StringTree::~StringTree((StringTree *)&_kjCondition_4);
  }
  Array<char>::~Array(&_kjCondition.right.content);
  str<char_const(&)[4]>((String *)&pieceCount,(kj *)0x423c58,params);
  str<char_const(&)[4]>((String *)&local_d8,(kj *)0x401abd,params_00);
  strTree<kj::String,kj::String>
            ((StringTree *)&_kjCondition_4,(kj *)&pieceCount,(String *)&local_d8,
             __return_storage_ptr__);
  strTree<kj::StringTree,char_const(&)[4]>
            ((StringTree *)&_kjCondition,(kj *)&_kjCondition_4,(StringTree *)0x3f3548,
             (char (*) [4])__return_storage_ptr__);
  StringTree::~StringTree((StringTree *)&_kjCondition_4);
  Array<char>::~Array(&local_d8);
  Array<char>::~Array((Array<char> *)&pieceCount);
  local_d8.ptr = "foobarbaz";
  StringTree::flatten((String *)&pieceCount,(StringTree *)&_kjCondition);
  DebugExpression<char_const(&)[10]>::operator==
            (&_kjCondition_4,(DebugExpression<char_const(&)[10]> *)&local_d8,(String *)&pieceCount);
  Array<char>::~Array((Array<char> *)&pieceCount);
  if ((_kjCondition_4.result == false) && (Debug::minSeverity < 3)) {
    StringTree::flatten((String *)&pieceCount,(StringTree *)&_kjCondition);
    params_2 = "failed: expected (\"foobarbaz\") == (tree.flatten())";
    Debug::
    log<char_const(&)[51],kj::_::DebugComparison<char_const(&)[10],kj::String>&,char_const(&)[10],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
               ,0x25,ERROR,
               "\"failed: expected \" \"(\\\"foobarbaz\\\") == (tree.flatten())\", _kjCondition, \"foobarbaz\", tree.flatten()"
               ,(char (*) [51])"failed: expected (\"foobarbaz\") == (tree.flatten())",
               &_kjCondition_4,(char (*) [10])0x41c56a,(String *)&pieceCount);
    Array<char>::~Array((Array<char> *)&pieceCount);
  }
  Array<char>::~Array(&_kjCondition_4.right.content);
  pieceCount = 0;
  this_00 = (StringTree *)(_kjCondition.op.content.ptr + 8);
  pAVar4 = (ArrayDisposer *)0x0;
  sVar1 = extraout_RDX;
  _kjCondition_4.left = (char (*) [10])&pieceCount;
  for (lVar2 = _kjCondition.op.content.size_ << 6; lVar2 != 0; lVar2 = lVar2 + -0x40) {
    pAVar3 = this_00[-1].branches.disposer;
    part.ptr = (char *)((long)pAVar3 - (long)pAVar4);
    if (pAVar4 <= pAVar3 && part.ptr != (char *)0x0) {
      part.size_ = sVar1;
      run::anon_class_8_1_6ec8c47f::operator()((anon_class_8_1_6ec8c47f *)&_kjCondition_4,part);
      pAVar4 = this_00[-1].branches.disposer;
    }
    StringTree::visit<kj::_::(anonymous_namespace)::TestCase29::run()::__0&>
              (this_00,(anon_class_8_1_6ec8c47f *)&_kjCondition_4);
    this_00 = (StringTree *)&this_00[1].text;
    sVar1 = extraout_RDX_00;
  }
  pAVar3 = (ArrayDisposer *)0x0;
  if (_kjCondition.right.content.size_ != 0) {
    pAVar3 = (ArrayDisposer *)(_kjCondition.right.content.size_ - 1);
  }
  part_00.ptr = (char *)((long)pAVar3 - (long)pAVar4);
  if (pAVar4 <= pAVar3 && part_00.ptr != (char *)0x0) {
    part_00.size_ = sVar1;
    run::anon_class_8_1_6ec8c47f::operator()((anon_class_8_1_6ec8c47f *)&_kjCondition_4,part_00);
  }
  _kjCondition_4.op.content.ptr._0_1_ = pieceCount == 3;
  _kjCondition_4.left = (char (*) [10])CONCAT44(_kjCondition_4.left._4_4_,3);
  _kjCondition_4.right.content.size_ = (size_t)anon_var_dwarf_4fea7;
  _kjCondition_4.right.content.disposer = (ArrayDisposer *)&DAT_00000005;
  _kjCondition_4.right.content.ptr = (char *)&pieceCount;
  if ((!(bool)_kjCondition_4.op.content.ptr._0_1_) && (Debug::minSeverity < 3)) {
    local_d8.ptr = (char *)CONCAT44(local_d8.ptr._4_4_,3);
    params_2 = "failed: expected (3u) == (pieceCount)";
    Debug::
    log<char_const(&)[38],kj::_::DebugComparison<unsigned_int,unsigned_int&>&,unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
               ,0x29,ERROR,
               "\"failed: expected \" \"(3u) == (pieceCount)\", _kjCondition, 3u, pieceCount",
               (char (*) [38])"failed: expected (3u) == (pieceCount)",
               (DebugComparison<unsigned_int,_unsigned_int_&> *)&_kjCondition_4,(uint *)&local_d8,
               (uint *)&pieceCount);
  }
  StringTree::~StringTree((StringTree *)&_kjCondition);
  local_e0 = "<foobarbaz>";
  local_e4[0] = (kj)0x3c;
  str<char_const(&)[4]>((String *)&local_d8,(kj *)0x423c58,params_01);
  str<char_const(&)[4]>((String *)&local_50,(kj *)0x3f3548,params_02);
  strTree<kj::String,char_const(&)[4],kj::String>
            ((StringTree *)&_kjCondition_4,(kj *)&local_d8,(String *)0x401abd,
             (char (*) [4])&local_50,(String *)params_2);
  local_34 = CONCAT31(local_34._1_3_,0x3e);
  str<char,kj::StringTree,char>
            ((String *)&pieceCount,(kj *)local_e4,(char *)&_kjCondition_4,
             (StringTree *)&stack0xffffffffffffffcc,params_2);
  DebugExpression<char_const(&)[12]>::operator==
            ((DebugComparison<const_char_(&)[12],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[12]> *)&local_e0,(String *)&pieceCount);
  Array<char>::~Array((Array<char> *)&pieceCount);
  StringTree::~StringTree((StringTree *)&_kjCondition_4);
  Array<char>::~Array(&local_50);
  Array<char>::~Array(&local_d8);
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    local_e0 = (char *)CONCAT71(local_e0._1_7_,0x3c);
    str<char_const(&)[4]>((String *)&local_d8,(kj *)0x423c58,params_03);
    str<char_const(&)[4]>((String *)&local_50,(kj *)0x3f3548,params_04);
    strTree<kj::String,char_const(&)[4],kj::String>
              ((StringTree *)&_kjCondition_4,(kj *)&local_d8,(String *)0x401abd,
               (char (*) [4])&local_50,(String *)params_2);
    local_e4[0] = (kj)0x3e;
    str<char,kj::StringTree,char>
              ((String *)&pieceCount,(kj *)&local_e0,(char *)&_kjCondition_4,(StringTree *)local_e4,
               params_2);
    Debug::
    log<char_const(&)[92],kj::_::DebugComparison<char_const(&)[12],kj::String>&,char_const(&)[12],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
               ,0x2c,ERROR,
               "\"failed: expected \" \"(\\\"<foobarbaz>\\\") == (str(\'<\', strTree(str(\\\"foo\\\"), \\\"bar\\\", str(\\\"baz\\\")), \'>\'))\", _kjCondition, \"<foobarbaz>\", str(\'<\', strTree(str(\"foo\"), \"bar\", str(\"baz\")), \'>\')"
               ,(char (*) [92])
                "failed: expected (\"<foobarbaz>\") == (str(\'<\', strTree(str(\"foo\"), \"bar\", str(\"baz\")), \'>\'))"
               ,(DebugComparison<const_char_(&)[12],_kj::String> *)&_kjCondition,
               (char (*) [12])"<foobarbaz>",(String *)&pieceCount);
    Array<char>::~Array((Array<char> *)&pieceCount);
    StringTree::~StringTree((StringTree *)&_kjCondition_4);
    Array<char>::~Array(&local_50);
    Array<char>::~Array(&local_d8);
  }
  Array<char>::~Array(&_kjCondition.right.content);
  return;
}

Assistant:

TEST(StringTree, StrTree) {
  EXPECT_EQ("foobar", strTree("foo", "bar").flatten());
  EXPECT_EQ("1 2 3 4", strTree(1, " ", 2u, " ", 3l, " ", 4ll).flatten());
  EXPECT_EQ("1.5 foo 1e15 bar -3", strTree(1.5f, " foo ", 1e15, " bar ", -3).flatten());
  EXPECT_EQ("foo", strTree('f', 'o', 'o').flatten());

  {
    StringTree tree = strTree(strTree(str("foo"), str("bar")), "baz");
    EXPECT_EQ("foobarbaz", tree.flatten());

    uint pieceCount = 0;
    tree.visit([&](ArrayPtr<const char> part) { ++pieceCount; EXPECT_EQ(3u, part.size()); });
    EXPECT_EQ(3u, pieceCount);
  }

  EXPECT_EQ("<foobarbaz>", str('<', strTree(str("foo"), "bar", str("baz")), '>'));
}